

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O1

int __thiscall Fl_Browser::lineno(Fl_Browser *this,void *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FL_BLINE *pFVar4;
  FL_BLINE *pFVar5;
  
  if (item == (void *)0x0) {
    return 0;
  }
  if (this->cache == (FL_BLINE *)item) {
    return this->cacheline;
  }
  if (this->first == (FL_BLINE *)item) {
    return 1;
  }
  if (this->last == (FL_BLINE *)item) {
    return this->lines;
  }
  if (this->cache == (FL_BLINE *)0x0) {
    this->cache = this->first;
    this->cacheline = 1;
  }
  pFVar4 = this->cache->prev;
  iVar2 = this->cacheline + -1;
  if (pFVar4 != (FL_BLINE *)item) {
    iVar3 = this->cacheline + 1;
    pFVar5 = this->cache->next;
    iVar1 = iVar2;
    do {
      iVar2 = iVar3;
      if (pFVar5 == (FL_BLINE *)item) break;
      if (pFVar4 == (FL_BLINE *)0x0) {
        pFVar4 = (FL_BLINE *)0x0;
        iVar2 = iVar1;
      }
      else {
        pFVar4 = pFVar4->prev;
        iVar2 = iVar1 + -1;
      }
      if (pFVar5 == (FL_BLINE *)0x0) {
        pFVar5 = (FL_BLINE *)0x0;
      }
      else {
        pFVar5 = pFVar5->next;
        iVar3 = iVar3 + 1;
      }
      iVar1 = iVar2;
    } while (pFVar4 != (FL_BLINE *)item);
  }
  this->cache = (FL_BLINE *)item;
  this->cacheline = iVar2;
  return iVar2;
}

Assistant:

int Fl_Browser::lineno(void *item) const {
  FL_BLINE* l = (FL_BLINE*)item;
  if (!l) return 0;
  if (l == cache) return cacheline;
  if (l == first) return 1;
  if (l == last) return lines;
  if (!cache) {
    ((Fl_Browser*)this)->cache = first;
    ((Fl_Browser*)this)->cacheline = 1;
  }
  // assume it is near cache, search both directions:
  FL_BLINE* b = cache->prev;
  int bnum = cacheline-1;
  FL_BLINE* f = cache->next;
  int fnum = cacheline+1;
  int n = 0;
  for (;;) {
    if (b == l) {n = bnum; break;}
    if (f == l) {n = fnum; break;}
    if (b) {b = b->prev; bnum--;}
    if (f) {f = f->next; fnum++;}
  }
  ((Fl_Browser*)this)->cache = l;
  ((Fl_Browser*)this)->cacheline = n;
  return n;
}